

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

void __thiscall vm_lookup_ext::init_ext(vm_lookup_ext *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  uVar1 = this->bucket_cnt;
  lVar2 = 0;
  for (lVar3 = 0; uVar1 != (uint)lVar3; lVar3 = lVar3 + 1) {
    this->buckets[lVar3] = (vm_lookup_val *)0x0;
    lVar2 = lVar2 + -8;
  }
  this->first_free = (vm_lookup_val *)((long)this + (0x20 - lVar2));
  uVar1 = this->value_cnt;
  lVar2 = (long)this + (0x48 - lVar2);
  while (bVar4 = uVar1 != 0, uVar1 = uVar1 - 1, bVar4) {
    *(long *)(lVar2 + -8) = lVar2;
    *(undefined4 *)(lVar2 + -0x28) = 0xd;
    *(undefined4 *)(lVar2 + -0x18) = 0xd;
    lVar2 = lVar2 + 0x28;
  }
  *(undefined8 *)(lVar2 + -0x30) = 0;
  return;
}

Assistant:

void vm_lookup_ext::init_ext()
{
    uint i;
    vm_lookup_val **bucketp;
    vm_lookup_val *valp;

    /* all of the buckets are initially empty */
    for (i = bucket_cnt, bucketp = buckets ; i != 0 ; --i, ++bucketp)
        *bucketp = 0;

    /* 
     *   Initialize the value free list.  We suballocate the value entry
     *   structures out of our main allocation block; the available memory
     *   for the structures comes immediately after the last bucket, so
     *   bucketp points to the first value entry. 
     */
    valp = (vm_lookup_val *)(void *)bucketp;
    first_free = valp;
    for (first_free = valp, i = value_cnt ; i != 0 ; --i, ++valp)
    {
        /* link it into the free list */
        valp->nxt = valp + 1;

        /* mark it as empty */
        valp->key.set_empty();
        valp->val.set_empty();
    }

    /* terminate the free list at the last element */
    (valp - 1)->nxt = 0;
}